

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_tags.cpp
# Opt level: O0

void __thiscall FTagManager::DumpTags(FTagManager *this)

{
  uint uVar1;
  FTagItem *pFVar2;
  uint local_18;
  uint local_14;
  uint i_1;
  uint i;
  FTagManager *this_local;
  
  local_14 = 0;
  while( true ) {
    uVar1 = TArray<FTagItem,_FTagItem>::Size(&this->allTags);
    if (uVar1 <= local_14) break;
    pFVar2 = TArray<FTagItem,_FTagItem>::operator[](&this->allTags,(ulong)local_14);
    uVar1 = pFVar2->target;
    pFVar2 = TArray<FTagItem,_FTagItem>::operator[](&this->allTags,(ulong)local_14);
    Printf("Sector %d, tag %d\n",(ulong)uVar1,(ulong)(uint)pFVar2->tag);
    local_14 = local_14 + 1;
  }
  local_18 = 0;
  while( true ) {
    uVar1 = TArray<FTagItem,_FTagItem>::Size(&this->allIDs);
    if (uVar1 <= local_18) break;
    pFVar2 = TArray<FTagItem,_FTagItem>::operator[](&this->allIDs,(ulong)local_18);
    uVar1 = pFVar2->target;
    pFVar2 = TArray<FTagItem,_FTagItem>::operator[](&this->allIDs,(ulong)local_18);
    Printf("Line %d, ID %d\n",(ulong)uVar1,(ulong)(uint)pFVar2->tag);
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void FTagManager::DumpTags()
{
	for (unsigned i = 0; i < allTags.Size(); i++)
	{
		Printf("Sector %d, tag %d\n", allTags[i].target, allTags[i].tag);
	}
	for (unsigned i = 0; i < allIDs.Size(); i++)
	{
		Printf("Line %d, ID %d\n", allIDs[i].target, allIDs[i].tag);
	}
}